

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree.h
# Opt level: O2

node_type * __thiscall
st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
          (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *this)

{
  empty_exception *this_00;
  allocator<char> local_31;
  string local_30;
  
  if (this->_root != (node_type *)0x0) {
    return this->_root;
  }
  this_00 = (empty_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"root(): empty tree has no root node",&local_31);
  empty_exception::empty_exception(this_00,&local_30);
  __cxa_throw(this_00,&empty_exception::typeinfo,exception::~exception);
}

Assistant:

bool empty() const { return _root == NULL; }